

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QDockWidgetGroupWindow::paintEvent(QDockWidgetGroupWindow *this,QPaintEvent *param_1)

{
  long lVar1;
  bool bVar2;
  QDockWidgetGroupLayout *this_00;
  long in_FS_OFFSET;
  undefined1 *local_98;
  QWidget *pQStack_90;
  QStyle *local_88;
  QStyleOptionFrame framOpt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDockWidgetGroupLayout *)QWidget::layout((QWidget *)this);
  bVar2 = QDockWidgetGroupLayout::nativeWindowDeco(this_00);
  if (!bVar2) {
    framOpt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    framOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame(&framOpt);
    QStyleOption::initFrom(&framOpt.super_QStyleOption,(QWidget *)this);
    local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter((QStylePainter *)&local_98,(QWidget *)this);
    QStylePainter::drawPrimitive
              ((QStylePainter *)&local_98,PE_FrameDockWidget,&framOpt.super_QStyleOption);
    QPainter::~QPainter((QPainter *)&local_98);
    QStyleOption::~QStyleOption(&framOpt.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::paintEvent(QPaintEvent *)
{
    QDockWidgetGroupLayout *lay = static_cast<QDockWidgetGroupLayout *>(layout());
    bool nativeDeco = lay->nativeWindowDeco();

    if (!nativeDeco) {
        QStyleOptionFrame framOpt;
        framOpt.initFrom(this);
        QStylePainter p(this);
        p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
    }
}